

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void update_spki(spki_table *s,spki_record record,_Bool added)

{
  long lVar1;
  rtr_socket *prVar2;
  char cVar3;
  long in_FS_OFFSET;
  int local_30;
  int size;
  int i;
  char c;
  socket_config *config;
  _Bool added_local;
  spki_table *s_local;
  
  prVar2 = record.socket;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((print_all_spki_updates) || (((ulong)record.socket[1].pfx_table & 0x10000000000) != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)&stdout_mutex);
    cVar3 = '-';
    if (added) {
      cVar3 = '+';
    }
    printf("%c ",(ulong)(uint)(int)cVar3);
    printf("HOST:  %s:%s\n",prVar2[1].connection_state_fp,prVar2[1].connection_state_fp_param_config
          );
    printf("ASN:  %u\n  ",(ulong)record.asn);
    printf("SKI:  ");
    for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
      printf("%02x",(ulong)record.ski[local_30]);
      if (local_30 < 0x13) {
        printf(":");
      }
    }
    printf("\n  ");
    printf("SPKI: ");
    for (local_30 = 0; local_30 < 0x5b; local_30 = local_30 + 1) {
      if ((local_30 % 0x28 == 0) && (local_30 != 0)) {
        printf("\n\t");
      }
      printf("%02x",(ulong)record.spki[local_30]);
      if (local_30 < 0x5a) {
        printf(":");
      }
    }
    printf("\n");
    pthread_mutex_unlock((pthread_mutex_t *)&stdout_mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void update_spki(struct spki_table *s __attribute__((unused)), const struct spki_record record, const bool added)
{
	const struct socket_config *config = (const struct socket_config *)record.socket;

	if (!print_all_spki_updates && !config->print_spki_updates)
		return;

	pthread_mutex_lock(&stdout_mutex);

	char c = added ? '+' : '-';

	printf("%c ", c);
	printf("HOST:  %s:%s\n", config->host, config->port);
	printf("ASN:  %u\n  ", record.asn);

	int i;
	int size = sizeof(record.ski);

	printf("SKI:  ");
	for (i = 0; i < size; i++) {
		printf("%02x", record.ski[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n  ");

	i = 0;
	size = sizeof(record.spki);
	printf("SPKI: ");
	for (i = 0; i < size; i++) {
		if ((i % 40 == 0) && (i != 0))
			printf("\n	");

		printf("%02x", record.spki[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n");

	pthread_mutex_unlock(&stdout_mutex);
}